

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldump.c
# Opt level: O0

void DumpBlock(void *b,size_t size,DumpState *D)

{
  int *piVar1;
  int iVar2;
  DumpState *D_local;
  size_t size_local;
  void *b_local;
  
  if ((D->status == 0) && (size != 0)) {
    piVar1 = *(int **)&D->L[-1].hookmask;
    iVar2 = *piVar1 + -1;
    *piVar1 = iVar2;
    if (iVar2 != 0) {
      __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(D->L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldump.c"
                    ,0x2f,"void DumpBlock(const void *, size_t, DumpState *)");
    }
    iVar2 = (*D->writer)(D->L,b,size,D->data);
    D->status = iVar2;
    piVar1 = *(int **)&D->L[-1].hookmask;
    iVar2 = *piVar1;
    *piVar1 = iVar2 + 1;
    if (iVar2 != 0) {
      __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(D->L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldump.c"
                    ,0x31,"void DumpBlock(const void *, size_t, DumpState *)");
    }
  }
  return;
}

Assistant:

static void DumpBlock (const void *b, size_t size, DumpState *D) {
  if (D->status == 0 && size > 0) {
    lua_unlock(D->L);
    D->status = (*D->writer)(D->L, b, size, D->data);
    lua_lock(D->L);
  }
}